

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ComponentManager.cpp
# Opt level: O2

void __thiscall ComponentManager::~ComponentManager(ComponentManager *this)

{
  ~ComponentManager(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

ComponentManager::~ComponentManager()
{
	// release references to all objects.
	for (JetHead::list<ClassInfo*>::iterator i = mClasses.begin();
		 i != mClasses.end(); ++i)
	{
		(*i)->mClass->Release();
		delete *i;
	}
	// delete all the ClassInfo's
	mClasses.clear();

	// release references to all objects.
	for (JetHead::list<ModuleInfo*>::iterator i = mModules.begin();
		 i != mModules.end(); ++i)
	{
		(*i)->mModule->Release();
		delete *i;
	}
	// delete all the ModuleInfo's
	mModules.clear();
}